

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_def.c
# Opt level: O3

upb_MessageValue upb_FieldDef_Default(upb_FieldDef *f)

{
  str_t *psVar1;
  undefined8 in_RAX;
  size_t in_RDX;
  upb_MessageValue uVar2;
  undefined8 local_8;
  
  if ((f->label_ == kUpb_Label_Repeated) ||
     ((f->type_ & ~kUpb_FieldType_Double) == kUpb_FieldType_Group)) {
    local_8 = (char *)0x0;
  }
  else {
    local_8._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
    switch(*(undefined4 *)
            (upb_FieldType_CType_c_type + (ulong)(f->type_ - kUpb_FieldType_Double) * 4)) {
    case 1:
      local_8 = (char *)CONCAT71((int7)((ulong)in_RAX >> 8),(f->defaultval).boolean);
      break;
    case 2:
      local_8 = (char *)CONCAT44(local_8._4_4_,(f->defaultval).flt);
      break;
    case 3:
    case 4:
    case 5:
      local_8 = (char *)CONCAT44(local_8._4_4_,(f->defaultval).flt);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/reflection/field_def.c"
                    ,0xcc,"upb_MessageValue upb_FieldDef_Default(const upb_FieldDef *)");
    case 7:
      local_8 = (char *)(f->defaultval).sint;
      break;
    case 8:
    case 9:
      local_8 = (char *)(f->defaultval).sint;
      break;
    case 10:
    case 0xb:
      psVar1 = (f->defaultval).str;
      if (psVar1 == (str_t *)0x0) {
        local_8 = (char *)0x0;
        in_RDX = 0;
      }
      else {
        local_8 = psVar1->str;
        in_RDX = psVar1->len;
      }
    }
  }
  uVar2.str_val.size = in_RDX;
  uVar2.double_val = (double)local_8;
  return uVar2;
}

Assistant:

upb_MessageValue upb_FieldDef_Default(const upb_FieldDef* f) {
  upb_MessageValue ret;

  if (upb_FieldDef_IsRepeated(f) || upb_FieldDef_IsSubMessage(f)) {
    return (upb_MessageValue){.msg_val = NULL};
  }

  switch (upb_FieldDef_CType(f)) {
    case kUpb_CType_Bool:
      return (upb_MessageValue){.bool_val = f->defaultval.boolean};
    case kUpb_CType_Int64:
      return (upb_MessageValue){.int64_val = f->defaultval.sint};
    case kUpb_CType_UInt64:
      return (upb_MessageValue){.uint64_val = f->defaultval.uint};
    case kUpb_CType_Enum:
    case kUpb_CType_Int32:
      return (upb_MessageValue){.int32_val = (int32_t)f->defaultval.sint};
    case kUpb_CType_UInt32:
      return (upb_MessageValue){.uint32_val = (uint32_t)f->defaultval.uint};
    case kUpb_CType_Float:
      return (upb_MessageValue){.float_val = f->defaultval.flt};
    case kUpb_CType_Double:
      return (upb_MessageValue){.double_val = f->defaultval.dbl};
    case kUpb_CType_String:
    case kUpb_CType_Bytes: {
      str_t* str = f->defaultval.str;
      if (str) {
        return (upb_MessageValue){
            .str_val = (upb_StringView){.data = str->str, .size = str->len}};
      } else {
        return (upb_MessageValue){
            .str_val = (upb_StringView){.data = NULL, .size = 0}};
      }
    }
    default:
      UPB_UNREACHABLE();
  }

  return ret;
}